

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

void __thiscall flatbuffers::Parser::ParseField(Parser *this,StructDef *struct_def)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Base_ptr p_Var2;
  pointer pcVar3;
  FieldDef *def;
  const_iterator cVar4;
  undefined8 extraout_RAX;
  Parser *unaff_RBP;
  Parser *this_00;
  Parser *this_01;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string name;
  string dc;
  undefined1 local_a8 [32];
  _Base_ptr local_88;
  StructDef *pSStack_80;
  EnumDef *local_78;
  string local_70;
  _Base_ptr local_50 [4];
  
  this_01 = (Parser *)local_a8;
  paVar1 = &local_70.field_2;
  pcVar3 = (this->attribute_)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (this->attribute_)._M_string_length);
  p_Var2 = (_Base_ptr)(local_50 + 2);
  pcVar3 = (this->doc_comment_)._M_dataplus._M_p;
  local_50[0] = p_Var2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar3,pcVar3 + (this->doc_comment_)._M_string_length);
  Expect(this,4);
  Expect(this,0x3a);
  local_88 = (_Base_ptr)0x0;
  pSStack_80 = (StructDef *)0x0;
  local_78 = (EnumDef *)0x0;
  this_00 = this;
  ParseType(this,(Type *)&local_88);
  if (struct_def->fixed == true) {
    if ((0xb < (BaseType)local_88 - BASE_TYPE_UTYPE) &&
       (((BaseType)local_88 != BASE_TYPE_STRUCT || (pSStack_80->fixed == false)))) {
      local_a8._0_8_ = local_a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a8,"structs_ may contain only scalar or struct fields","");
      Error((string *)local_a8);
      goto LAB_0010ca6c;
    }
  }
  unaff_RBP = (Parser *)(local_a8 + 0x10);
  if ((BaseType)local_88 == BASE_TYPE_UNION) {
    local_a8._0_8_ = unaff_RBP;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a8,local_70._M_dataplus._M_p,
               local_70._M_string_length + local_70._M_dataplus._M_p);
    std::__cxx11::string::append(local_a8);
    AddField(this_01,struct_def,(string *)local_a8,&local_78->underlying_type);
    this_00 = (Parser *)local_a8._0_8_;
    if ((Parser *)local_a8._0_8_ != unaff_RBP) {
      operator_delete((void *)local_a8._0_8_);
    }
  }
  def = AddField(this_00,struct_def,&local_70,(Type *)&local_88);
  if (this->token_ == 0x3d) {
    Next(this);
    ParseSingleValue(this,&def->value);
  }
  std::__cxx11::string::_M_assign((string *)&(def->super_Definition).doc_comment);
  ParseMetaData(this,&def->super_Definition);
  local_a8._0_8_ = unaff_RBP;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"deprecated","");
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                  *)&(def->super_Definition).attributes,(key_type *)local_a8);
  if ((_Rb_tree_header *)cVar4._M_node ==
      &(def->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
    bVar5 = false;
  }
  else {
    bVar5 = *(long *)(cVar4._M_node + 2) != 0;
  }
  def->deprecated = bVar5;
  if ((Parser *)local_a8._0_8_ != unaff_RBP) {
    operator_delete((void *)local_a8._0_8_);
  }
  if ((def->deprecated != true) || (struct_def->fixed != true)) {
    Expect(this,0x3b);
    if (local_50[0] != p_Var2) {
      operator_delete(local_50[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    return;
  }
LAB_0010ca6c:
  local_a8._0_8_ = unaff_RBP;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a8,"can\'t deprecate fields in a struct","");
  Error((string *)local_a8);
  if ((Parser *)local_a8._0_8_ != unaff_RBP) {
    operator_delete((void *)local_a8._0_8_);
  }
  if (local_50[0] != p_Var2) {
    operator_delete(local_50[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void Parser::ParseField(StructDef &struct_def) {
  std::string name = attribute_;
  std::string dc = doc_comment_;
  Expect(kTokenIdentifier);
  Expect(':');
  Type type;
  ParseType(type);

  if (struct_def.fixed && !IsScalar(type.base_type) && !IsStruct(type))
    Error("structs_ may contain only scalar or struct fields");

  if (type.base_type == BASE_TYPE_UNION) {
    // For union fields, add a second auto-generated field to hold the type,
    // with _type appended as the name.
    AddField(struct_def, name + "_type", type.enum_def->underlying_type);
  }

  auto &field = AddField(struct_def, name, type);

  if (token_ == '=') {
    Next();
    ParseSingleValue(field.value);
  }

  field.doc_comment = dc;
  ParseMetaData(field);
  field.deprecated = field.attributes.Lookup("deprecated") != nullptr;
  if (field.deprecated && struct_def.fixed)
    Error("can't deprecate fields in a struct");

  Expect(';');
}